

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O3

long __thiscall
gl4cts::anon_unknown_0::AdvancedConditionalDispatching::Setup(AdvancedConditionalDispatching *this)

{
  this->m_query[0] = 0;
  this->m_query[1] = 0;
  this->m_storage_buffer = 0;
  this->m_dispatch_buffer = 0;
  this->m_program_vsfs = 0;
  this->m_program_cs = 0;
  this->m_vertex_array = 0;
  this->m_query[0] = 0;
  return 0;
}

Assistant:

virtual long Setup()
	{
		m_program_vsfs = 0;
		m_program_cs   = 0;
		m_vertex_array = 0;
		memset(m_query, 0, sizeof(m_query));
		m_storage_buffer  = 0;
		m_dispatch_buffer = 0;
		return NO_ERROR;
	}